

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmp-tracking-gain-estimator.cpp
# Opt level: O3

void __thiscall
stateObservation::ZmpTrackingGainEstimator::setGain
          (ZmpTrackingGainEstimator *this,Vector3 *gain,Vector3 *uncertainty)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  ActualDstType actualDst;
  double *pdVar5;
  double dStack_148;
  double *pdStack_140;
  DenseStorage<double,__1,__1,__1,_0> local_138;
  undefined8 local_120;
  double dStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  double local_f8;
  double local_e8;
  double dStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  double local_c8;
  double dStack_c0;
  double local_b8;
  double dStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  double local_88;
  double dStack_80;
  double local_78;
  double dStack_70;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  double local_38;
  double dStack_30;
  double local_28;
  
  pdStack_140 = (double *)0x181907;
  setGain(this,gain);
  pdStack_140 = (double *)0x181919;
  KalmanFilterBase::getStateCovariance
            ((Pmatrix *)&local_138,&(this->filter_).super_KalmanFilterBase);
  if ((local_138.m_rows != 5) || (local_138.m_cols != 5)) {
    pdStack_140 = (double *)0x181aef;
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, 5, 5>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 5, 5>]"
                 );
  }
  local_e8 = *local_138.m_data;
  dStack_e0 = local_138.m_data[1];
  pdVar5 = &local_78;
  local_c8 = local_138.m_data[4];
  dStack_c0 = local_138.m_data[5];
  local_b8 = local_138.m_data[6];
  dStack_b0 = local_138.m_data[7];
  local_88 = local_138.m_data[0xc];
  dStack_80 = local_138.m_data[0xd];
  local_78 = local_138.m_data[0xe];
  dStack_70 = local_138.m_data[0xf];
  local_68 = local_138.m_data[0x10];
  dStack_60 = local_138.m_data[0x11];
  local_58 = local_138.m_data[0x12];
  dStack_50 = local_138.m_data[0x13];
  local_38 = local_138.m_data[0x16];
  dStack_30 = local_138.m_data[0x17];
  local_28 = local_138.m_data[0x18];
  pdStack_140 = (double *)0x18199e;
  free(local_138.m_data);
  dStack_70 = 0.0;
  local_68 = 0.0;
  local_48 = 0;
  uStack_40 = 0;
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0.0;
  dStack_b0 = 0.0;
  uStack_a8 = 0;
  local_a0 = 0;
  uStack_98 = 0;
  local_90 = 0;
  dVar2 = (uncertainty->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[0];
  dVar3 = (uncertainty->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[1];
  dVar1 = (uncertainty->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[2];
  local_120 = 0;
  local_100 = 0;
  local_110 = 0;
  uStack_108 = 0;
  local_138.m_rows = 0;
  local_138.m_cols = 0;
  local_138.m_data = (double *)(dVar2 * dVar2);
  dStack_118 = dVar3 * dVar3;
  local_f8 = dVar1 * dVar1;
  lVar4 = 0x10;
  do {
    dVar1 = *(double *)((long)&pdStack_140 + lVar4);
    pdVar5[-2] = *(double *)((long)&dStack_148 + lVar4);
    pdVar5[-1] = dVar1;
    *pdVar5 = *(double *)((long)&local_138.m_data + lVar4);
    lVar4 = lVar4 + 0x18;
    pdVar5 = pdVar5 + 5;
  } while (lVar4 != 0x58);
  local_138.m_data = (double *)0x0;
  local_138.m_rows = 0;
  local_138.m_cols = 0;
  pdStack_140 = (double *)0x181a48;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_138,0x19,5,5);
  if ((local_138.m_rows != 5) || (local_138.m_cols != 5)) {
    pdStack_140 = (double *)0x181a6f;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_138,0x19,5,5);
    if ((local_138.m_rows != 5) || (local_138.m_cols != 5)) {
      pdStack_140 = (double *)&LAB_00181b0e;
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 5, 5>, T1 = double, T2 = double]"
                   );
    }
  }
  pdVar5 = local_138.m_data;
  pdStack_140 = (double *)0x181a9a;
  memcpy(local_138.m_data,&local_e8,0xc0);
  pdVar5[0x18] = local_28;
  pdStack_140 = (double *)0x181ab8;
  KalmanFilterBase::setStateCovariance
            (&(this->filter_).super_KalmanFilterBase,(Pmatrix *)&local_138);
  pdStack_140 = (double *)0x181ac1;
  free(local_138.m_data);
  return;
}

Assistant:

void ZmpTrackingGainEstimator::setGain(const Vector3 & gain, const Vector3 & uncertainty)
{
  setGain(gain);
  Matrix5 P = filter_.getStateCovariance();
  /// resetting the non diagonal parts
  P.topRightCorner<2, 3>().setZero();
  P.bottomLeftCorner<3, 2>().setZero();
  /// updating the gain part
  P.bottomRightCorner<3, 3>() = Vec3ToSqDiag_(uncertainty);
  filter_.setStateCovariance(P);
}